

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.h
# Opt level: O1

bool __thiscall ArgParser::ArgIterator::match(ArgIterator *this,char *name)

{
  char *__s2;
  long lVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  range_error *this_00;
  ulong uVar5;
  ulong __n;
  
  if (this->i != this->argc) {
    if (*name == '\0') {
      __n = 0;
    }
    else {
      uVar4 = 0;
      do {
        __n = uVar4 + 1;
        lVar1 = uVar4 + 1;
        uVar4 = __n;
      } while (name[lVar1] != '\0');
    }
    __s2 = this->p;
    if (*__s2 == '\0') {
      uVar4 = 0;
    }
    else {
      uVar5 = 0;
      do {
        uVar4 = uVar5 + 1;
        lVar1 = uVar5 + 1;
        uVar5 = uVar4;
      } while (__s2[lVar1] != '\0');
    }
    if ((uVar4 < __n) || ((__n != 0 && (iVar3 = bcmp(name,__s2,__n), iVar3 != 0)))) {
      bVar2 = false;
    }
    else {
      this->p = __s2 + __n;
      this->longmatch = true;
      bVar2 = true;
    }
    return bVar2;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this_00,"arg out of range");
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

bool match(const char*name)
        {
            if (i==argc)
                throw std::range_error("arg out of range");
            auto namelen = stringlength(name);
            if (namelen > stringlength(p))
                return false;
            if (std::equal(name, name+namelen, p)) {
                p += namelen;
                longmatch = true;
                return true;
            }
            return false;
        }